

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
cpprofiler::MessageMarshalling::serialize(MessageMarshalling *this)

{
  bool bVar1;
  undefined1 uVar2;
  Message *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  NodeUID p_uid;
  NodeUID n_uid;
  size_t dataSize;
  vector<char,_std::allocator<char>_> *data;
  Field in_stack_fffffffffffffeac;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  string *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x288a77);
  Message::isNode(in_RSI);
  bVar1 = Message::has_label(in_RSI);
  if (bVar1) {
    Message::label_abi_cxx11_(in_RSI);
    std::__cxx11::string::size();
  }
  bVar1 = Message::has_nogood(in_RSI);
  if (bVar1) {
    Message::nogood_abi_cxx11_(in_RSI);
    std::__cxx11::string::size();
  }
  bVar1 = Message::has_info(in_RSI);
  if (bVar1) {
    Message::info_abi_cxx11_(in_RSI);
    std::__cxx11::string::size();
  }
  std::vector<char,_std::allocator<char>_>::reserve
            ((vector<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  Message::type(in_RSI);
  serializeType(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  bVar1 = Message::isNode(in_RSI);
  if (bVar1) {
    Message::nodeUID(in_RSI);
    serialize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    serialize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    serialize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    Message::parentUID(in_RSI);
    serialize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    serialize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    serialize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    Message::alt(in_RSI);
    serialize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    Message::kids(in_RSI);
    serialize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    Message::status(in_RSI);
    serialize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  }
  bVar1 = Message::has_version(in_RSI);
  if (bVar1) {
    serializeField(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    Message::version(in_RSI);
    serialize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  }
  bVar1 = Message::has_label(in_RSI);
  if (bVar1) {
    serializeField(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    in_stack_fffffffffffffed0 = Message::label_abi_cxx11_(in_RSI);
    serialize((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffed0,
              (string *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  }
  uVar2 = Message::has_nogood(in_RSI);
  if ((bool)uVar2) {
    serializeField(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    Message::nogood_abi_cxx11_(in_RSI);
    serialize((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffed0,
              (string *)CONCAT17(uVar2,in_stack_fffffffffffffec8));
  }
  bVar1 = Message::has_info(in_RSI);
  if (bVar1) {
    serializeField(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    Message::info_abi_cxx11_(in_RSI);
    serialize((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffed0,
              (string *)CONCAT17(uVar2,in_stack_fffffffffffffec8));
  }
  return in_RDI;
}

Assistant:

std::vector<char> serialize(void) const {
    std::vector<char> data;
    size_t dataSize = 1 + (msg.isNode() ? 4 * 8 + 1 : 0) +
        (msg.has_label() ? 1 + 4 + msg.label().size() : 0) +
        (msg.has_nogood() ? 1 + 4 + msg.nogood().size() : 0) +
        (msg.has_info() ? 1 + 4 + msg.info().size() : 0);
    data.reserve(dataSize);

    serializeType(data, msg.type());
    if (msg.isNode()) {
      // serialize NodeId node
      auto n_uid = msg.nodeUID();
      serialize(data, n_uid.nid);
      serialize(data, n_uid.rid);
      serialize(data, n_uid.tid);
      // serialize NodeId parent
      auto p_uid = msg.parentUID();
      serialize(data, p_uid.nid);
      serialize(data, p_uid.rid);
      serialize(data, p_uid.tid);
      // Other Data
      serialize(data, msg.alt());
      serialize(data, msg.kids());
      serialize(data, msg.status());
    }

    if(msg.has_version()) {
      serializeField(data, VERSION);
      serialize(data, msg.version());
    }
    if (msg.has_label()) {
      serializeField(data, LABEL);
      serialize(data, msg.label());
    }
    if (msg.has_nogood()) {
      serializeField(data, NOGOOD);
      serialize(data, msg.nogood());
    }
    if (msg.has_info()) {
      serializeField(data, INFO);
      serialize(data, msg.info());
    }
    return data;
  }